

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O2

bool __thiscall
Js::AsmJsByteCodeWriter::TryWriteAsmReg9<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,RegSlot R0,RegSlot R1,RegSlot R2,RegSlot R3,
          RegSlot R4,RegSlot R5,RegSlot R6,RegSlot R7,RegSlot R8)

{
  bool bVar1;
  undefined1 local_11;
  undefined1 local_10;
  undefined1 local_f;
  undefined1 local_e;
  undefined1 local_d;
  undefined1 local_c;
  undefined1 local_b;
  undefined1 local_a;
  OpLayoutT_AsmReg9<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  
  if ((((((DAT_0143bfdd == '\0') && (DAT_0143bfdc == '\0')) &&
        (local_11 = (undefined1)R0, R0 < 0x100)) &&
       ((local_10 = (undefined1)R1, R1 < 0x100 && (local_f = (undefined1)R2, R2 < 0x100)))) &&
      ((local_e = (undefined1)R3, R3 < 0x100 &&
       ((local_d = (undefined1)R4, R4 < 0x100 && (local_c = (undefined1)R5, R5 < 0x100)))))) &&
     ((local_b = (undefined1)R6, R6 < 0x100 &&
      ((local_a = (undefined1)R7, R7 < 0x100 && (layout.R0 = (RegSlotType)R8, R8 < 0x100)))))) {
    ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)0>
              (&(this->super_ByteCodeWriter).m_byteCodeData,op,&local_11,9,
               &this->super_ByteCodeWriter,false);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmReg9(OpCodeAsmJs op, RegSlot R0, RegSlot R1, RegSlot R2, RegSlot R3, RegSlot R4, RegSlot R5, RegSlot R6, RegSlot R7, RegSlot R8)
    {
        OpLayoutT_AsmReg9<SizePolicy> layout;
        if (SizePolicy::Assign(layout.R0, R0) && SizePolicy::Assign(layout.R1, R1) && SizePolicy::Assign(layout.R2, R2) && SizePolicy::Assign(layout.R3, R3) && SizePolicy::Assign(layout.R4, R4) &&
            SizePolicy::Assign(layout.R5, R5) && SizePolicy::Assign(layout.R6, R6) && SizePolicy::Assign(layout.R7, R7) && SizePolicy::Assign(layout.R8, R8))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }